

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O2

void __thiscall
prevector<28U,_unsigned_char,_unsigned_int,_int>::resize_uninitialized
          (prevector<28U,_unsigned_char,_unsigned_int,_int> *this,size_type new_size)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = this->_size;
  if (uVar2 < 0x1d) {
    uVar3 = 0x1c;
  }
  else {
    uVar3 = (this->_union).indirect_contents.capacity;
  }
  if (uVar3 < new_size) {
    change_capacity(this,new_size);
    uVar2 = this->_size;
    uVar3 = uVar2 - 0x1d;
    if (uVar2 < 0x1d) {
      uVar3 = uVar2;
    }
  }
  else {
    uVar3 = uVar2 - 0x1d;
    if (uVar2 < 0x1d) {
      uVar3 = uVar2;
    }
    if (new_size < uVar3) {
      ppVar4 = this;
      if (0x1c < uVar2) {
        ppVar4 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                 (this->_union).indirect_contents.indirect;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        erase(this,(uchar *)((long)&ppVar4->_union + (long)(int)new_size),
              (uchar *)((long)&ppVar4->_union + (long)(int)uVar3));
        return;
      }
      goto LAB_0019fd41;
    }
  }
  this->_size = (uVar2 + new_size) - uVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_0019fd41:
  __stack_chk_fail();
}

Assistant:

inline void resize_uninitialized(size_type new_size) {
        // resize_uninitialized changes the size of the prevector but does not initialize it.
        // If size < new_size, the added elements must be initialized explicitly.
        if (capacity() < new_size) {
            change_capacity(new_size);
            _size += new_size - size();
            return;
        }
        if (new_size < size()) {
            erase(item_ptr(new_size), end());
        } else {
            _size += new_size - size();
        }
    }